

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

DynamicObject * __thiscall
JsrtDebuggerObjectProperty::GetJSONObject
          (JsrtDebuggerObjectProperty *this,ScriptContext *scriptContext,bool forceSetValueProp)

{
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar1;
  IDiagObjectModelDisplay *objectDisplayRef;
  bool bVar2;
  int iVar3;
  DynamicObject *object;
  undefined4 extraout_var;
  size_t len;
  
  pWVar1 = this->objectDisplay;
  bVar2 = Memory::ReferencedArenaAdapter::AddStrongReference(pWVar1->adapter);
  objectDisplayRef = pWVar1->p;
  if (objectDisplayRef == (IDiagObjectModelDisplay *)0x0 || !bVar2) {
    object = (DynamicObject *)0x0;
  }
  else {
    object = Js::JavascriptLibrary::CreateObject
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
    iVar3 = (**objectDisplayRef->_vptr_IDiagObjectModelDisplay)(objectDisplayRef);
    len = PAL_wcslen((char16_t *)CONCAT44(extraout_var,iVar3));
    JsrtDebugUtils::AddPropertyToObject
              (object,(JsrtDebugPropertyId)0x13,(char16_t *)CONCAT44(extraout_var,iVar3),len,
               scriptContext);
    JsrtDebugUtils::AddPropertyType(object,objectDisplayRef,scriptContext,forceSetValueProp);
    JsrtDebugUtils::AddPropertyToObject
              (object,(JsrtDebugPropertyId)0xe,(this->super_JsrtDebuggerObjectBase).handle,
               scriptContext);
    Memory::ReferencedArenaAdapter::ReleaseStrongReference(this->objectDisplay->adapter);
  }
  return object;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectProperty::GetJSONObject(Js::ScriptContext* scriptContext, bool forceSetValueProp)
{
    Js::IDiagObjectModelDisplay* objectDisplayRef = this->objectDisplay->GetStrongReference();

    Js::DynamicObject* propertyObject = nullptr;

    if (objectDisplayRef != nullptr)
    {
        propertyObject = scriptContext->GetLibrary()->CreateObject();

        LPCWSTR name = objectDisplayRef->Name();

        JsrtDebugUtils::AddPropertyToObject(propertyObject, JsrtDebugPropertyId::name, name, wcslen(name), scriptContext);

        JsrtDebugUtils::AddPropertyType(propertyObject, objectDisplayRef, scriptContext, forceSetValueProp); // Will add type, value, display, className, propertyAttributes

        JsrtDebugUtils::AddPropertyToObject(propertyObject, JsrtDebugPropertyId::handle, this->GetHandle(), scriptContext);

        this->objectDisplay->ReleaseStrongReference();
    }

    return propertyObject;
}